

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodePtr xmlXPathNextAncestor(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlElementType xVar1;
  xmlXPathContextPtr pxVar2;
  xmlDocPtr pxVar3;
  _xmlNode *p_Var4;
  int iVar5;
  xmlNodePtr pxVar6;
  xmlNsPtr ns;
  xmlNsPtr ns_1;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  pxVar2 = ctxt->context;
  if (pxVar2 == (xmlXPathContextPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  if (cur != (xmlNodePtr)0x0) {
    pxVar3 = pxVar2->doc;
    if (pxVar3->children == cur) {
      return (xmlNodePtr)pxVar3;
    }
    if (pxVar3 == (xmlDocPtr)cur) {
      return (xmlNodePtr)0x0;
    }
    xVar1 = cur->type;
    if (XML_XINCLUDE_END < xVar1) {
      return (xmlNodePtr)0x0;
    }
    if ((0x1bd1faU >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      if (xVar1 != XML_ATTRIBUTE_NODE) {
        if (xVar1 != XML_NAMESPACE_DECL) {
          return (xmlNodePtr)0x0;
        }
        pxVar6 = (xmlNodePtr)cur->_private;
        goto LAB_001c0eb2;
      }
    }
    else {
      p_Var4 = cur->parent;
      if (p_Var4 == (_xmlNode *)0x0) {
        return (xmlNodePtr)0x0;
      }
      if (p_Var4->type == XML_ELEMENT_NODE) {
        if (*p_Var4->name == ' ') {
          return (xmlNodePtr)0x0;
        }
        iVar5 = xmlStrEqual(p_Var4->name,(xmlChar *)"fake node libxslt");
        if (iVar5 != 0) {
          return (xmlNodePtr)0x0;
        }
      }
    }
    return cur->parent;
  }
  pxVar6 = pxVar2->node;
  if (pxVar6 == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  xVar1 = pxVar6->type;
  if (XML_XINCLUDE_END < xVar1) {
    return (xmlNodePtr)0x0;
  }
  if ((0x1bd1faU >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
    p_Var4 = pxVar6->parent;
    if (p_Var4 == (_xmlNode *)0x0) {
      return (xmlNodePtr)pxVar2->doc;
    }
    if (p_Var4->type == XML_ELEMENT_NODE) {
      if (*p_Var4->name == ' ') {
        return (xmlNodePtr)0x0;
      }
      iVar5 = xmlStrEqual(p_Var4->name,(xmlChar *)"fake node libxslt");
      if (iVar5 != 0) {
        return (xmlNodePtr)0x0;
      }
    }
    return ctxt->context->node->parent;
  }
  if (xVar1 == XML_ATTRIBUTE_NODE) {
    return pxVar6->parent;
  }
  if (xVar1 != XML_NAMESPACE_DECL) {
    return (xmlNodePtr)0x0;
  }
  pxVar6 = (xmlNodePtr)pxVar6->_private;
LAB_001c0eb2:
  if ((pxVar6 != (xmlNodePtr)0x0) && (pxVar6->type != XML_NAMESPACE_DECL)) {
    return pxVar6;
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextAncestor(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    /*
     * the parent of an attribute or namespace node is the element
     * to which the attribute or namespace node is attached
     * !!!!!!!!!!!!!
     */
    if (cur == NULL) {
	if (ctxt->context->node == NULL) return(NULL);
	switch (ctxt->context->node->type) {
            case XML_ELEMENT_NODE:
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
            case XML_ENTITY_REF_NODE:
            case XML_ENTITY_NODE:
            case XML_PI_NODE:
            case XML_COMMENT_NODE:
	    case XML_DTD_NODE:
	    case XML_ELEMENT_DECL:
	    case XML_ATTRIBUTE_DECL:
	    case XML_ENTITY_DECL:
            case XML_NOTATION_NODE:
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		if (ctxt->context->node->parent == NULL)
		    return((xmlNodePtr) ctxt->context->doc);
		if ((ctxt->context->node->parent->type == XML_ELEMENT_NODE) &&
		    ((ctxt->context->node->parent->name[0] == ' ') ||
		     (xmlStrEqual(ctxt->context->node->parent->name,
				 BAD_CAST "fake node libxslt"))))
		    return(NULL);
		return(ctxt->context->node->parent);
            case XML_ATTRIBUTE_NODE: {
		xmlAttrPtr tmp = (xmlAttrPtr) ctxt->context->node;

		return(tmp->parent);
	    }
            case XML_DOCUMENT_NODE:
            case XML_DOCUMENT_TYPE_NODE:
            case XML_DOCUMENT_FRAG_NODE:
            case XML_HTML_DOCUMENT_NODE:
                return(NULL);
	    case XML_NAMESPACE_DECL: {
		xmlNsPtr ns = (xmlNsPtr) ctxt->context->node;

		if ((ns->next != NULL) &&
		    (ns->next->type != XML_NAMESPACE_DECL))
		    return((xmlNodePtr) ns->next);
		/* Bad, how did that namespace end up here ? */
                return(NULL);
	    }
	}
	return(NULL);
    }
    if (cur == ctxt->context->doc->children)
	return((xmlNodePtr) ctxt->context->doc);
    if (cur == (xmlNodePtr) ctxt->context->doc)
	return(NULL);
    switch (cur->type) {
	case XML_ELEMENT_NODE:
	case XML_TEXT_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_ENTITY_REF_NODE:
	case XML_ENTITY_NODE:
	case XML_PI_NODE:
	case XML_COMMENT_NODE:
	case XML_NOTATION_NODE:
	case XML_DTD_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    if (cur->parent == NULL)
		return(NULL);
	    if ((cur->parent->type == XML_ELEMENT_NODE) &&
		((cur->parent->name[0] == ' ') ||
		 (xmlStrEqual(cur->parent->name,
			      BAD_CAST "fake node libxslt"))))
		return(NULL);
	    return(cur->parent);
	case XML_ATTRIBUTE_NODE: {
	    xmlAttrPtr att = (xmlAttrPtr) cur;

	    return(att->parent);
	}
	case XML_NAMESPACE_DECL: {
	    xmlNsPtr ns = (xmlNsPtr) cur;

	    if ((ns->next != NULL) &&
	        (ns->next->type != XML_NAMESPACE_DECL))
	        return((xmlNodePtr) ns->next);
	    /* Bad, how did that namespace end up here ? */
            return(NULL);
	}
	case XML_DOCUMENT_NODE:
	case XML_DOCUMENT_TYPE_NODE:
	case XML_DOCUMENT_FRAG_NODE:
	case XML_HTML_DOCUMENT_NODE:
	    return(NULL);
    }
    return(NULL);
}